

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O3

Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_>
capnp::readMessage(AsyncInputStream *input,ReaderOptions options,ArrayPtr<capnp::word> scratchSpace)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  PromiseArena *pPVar3;
  void *pvVar4;
  TransformPromiseNodeBase *this;
  Promise<bool> promise;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> reader;
  undefined1 local_48 [16];
  undefined8 local_38;
  
  kj::heap<capnp::(anonymous_namespace)::AsyncMessageReader,capnp::ReaderOptions&>
            ((ReaderOptions *)(local_48 + 8));
  pPVar3 = local_38;
  anon_unknown_0::AsyncMessageReader::read
            ((AsyncMessageReader *)local_48,(int)local_38,(void *)options.traversalLimitInWords,
             scratchSpace.size_);
  uVar2 = local_48._0_8_;
  local_38._0_4_ = 0;
  local_38._4_4_ = 0;
  pPVar1 = ((PromiseArenaMember *)local_48._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_48._0_8_ - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    this = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)local_48,
               kj::_::
               SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:193:23)>
               ::anon_class_16_1_69694a01_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d0) = &PTR_destroy_006cb7f0;
    *(undefined8 *)((long)pvVar4 + 0x3f0) = local_48._8_8_;
    *(PromiseArena **)((long)pvVar4 + 0x3f8) = pPVar3;
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    ((PromiseArenaMember *)local_48._0_8_)->arena = (PromiseArena *)0x0;
    this = (TransformPromiseNodeBase *)(local_48._0_8_ + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)local_48,
               kj::_::
               SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:193:23)>
               ::anon_class_16_1_69694a01_for_func::operator());
    ((PromiseArenaMember *)(uVar2 + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006cb7f0;
    ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)local_48._8_8_
    ;
    ((PromiseArenaMember *)(uVar2 + -0x10))->arena = pPVar3;
    ((PromiseArenaMember *)(uVar2 + -0x30))->arena = pPVar1;
  }
  uVar2 = local_48._0_8_;
  input->_vptr_AsyncInputStream = (_func_int **)this;
  if ((PromiseArenaMember *)local_48._0_8_ != (PromiseArenaMember *)0x0) {
    local_48._0_8_ = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  return (PromiseBase)(PromiseBase)input;
}

Assistant:

kj::Promise<kj::Own<MessageReader>> readMessage(
    kj::AsyncInputStream& input, ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  auto reader = kj::heap<AsyncMessageReader>(options);
  auto promise = reader->read(input, scratchSpace);
  return promise.then([reader = kj::mv(reader)](bool success) mutable -> kj::Own<MessageReader> {
    if (!success) {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "Premature EOF."));
    }
    return kj::mv(reader);
  });
}